

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# switch.cpp
# Opt level: O1

void __thiscall QtMWidgets::Switch::mouseReleaseEvent(Switch *this,QMouseEvent *event)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  State SVar5;
  SwitchPrivate *pSVar6;
  int iVar7;
  
  if (*(int *)(event + 0x40) != 1) {
    event[0xc] = (QMouseEvent)0x0;
    return;
  }
  event[0xc] = (QMouseEvent)0x1;
  pSVar6 = (this->d).d;
  pSVar6->leftMouseButtonPressed = false;
  iVar4 = *(int *)(*(long *)&this->field_0x20 + 0x14);
  iVar7 = *(int *)(*(long *)&this->field_0x20 + 0x1c);
  iVar1 = pSVar6->radius;
  iVar2 = pSVar6->mouseMoveDelta;
  iVar3 = FingerGeometry::touchBounce();
  if (iVar2 <= iVar3) {
    pSVar6 = (this->d).d;
    if (AcceptedUncheck < pSVar6->state) {
      if (1 < pSVar6->state - NotAcceptedCheck) {
        return;
      }
LAB_0016fd90:
      SVar5 = NotAcceptedUncheck;
      goto LAB_0016fd92;
    }
LAB_0016fd7f:
    SVar5 = NotAcceptedCheck;
LAB_0016fd92:
    SwitchPrivate::setState(pSVar6,SVar5);
    return;
  }
  iVar7 = iVar7 - (iVar4 + iVar1 * 2);
  pSVar6 = (this->d).d;
  SVar5 = pSVar6->state;
  if ((iVar7 - (iVar7 + 1 >> 0x1f)) + 1 >> 1 < pSVar6->offset) {
    if (SVar5 < NotAcceptedCheck) goto LAB_0016fd7f;
  }
  else if ((SVar5 & ~AcceptedUncheck) == NotAcceptedCheck) goto LAB_0016fd90;
  iVar4 = 0;
  if (AcceptedUncheck < SVar5) {
    if (1 < SVar5 - NotAcceptedCheck) goto LAB_0016fdc4;
    iVar4 = ~*(uint *)(*(long *)&this->field_0x20 + 0x14) +
            *(int *)(*(long *)&this->field_0x20 + 0x1c) + pSVar6->radius * -2;
  }
  pSVar6->offset = iVar4;
LAB_0016fdc4:
  QWidget::update();
  return;
}

Assistant:

void
Switch::mouseReleaseEvent( QMouseEvent * event )
{
	if( event->button() == Qt::LeftButton )
	{
		event->accept();

		d->leftMouseButtonPressed = false;

		const int distance = rect().width() - d->radius * 2;

		if( d->mouseMoveDelta <= FingerGeometry::touchBounce() )
		{
			switch( d->state )
			{
				case NotAcceptedCheck :
				case AcceptedCheck :
					d->setState( NotAcceptedUncheck );
				break;

				case NotAcceptedUncheck :
				case AcceptedUncheck :
					d->setState( NotAcceptedCheck );
				break;

				default :
					break;
			}

			return;
		}

		if( d->offset <= distance / 2 )
		{
			switch( d->state )
			{
				case NotAcceptedCheck :
				case AcceptedCheck :
					d->setState( NotAcceptedUncheck );
				break;

				default :
				{
					d->initOffset( rect() );
					update();
				}
				break;
			}
		}
		else
		{
			switch( d->state )
			{
				case NotAcceptedUncheck :
				case AcceptedUncheck :
					d->setState( NotAcceptedCheck );
				break;

				default :
				{
					d->initOffset( rect() );
					update();
				}
				break;
			}
		}
	}
	else
		event->ignore();
}